

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbolNoPlaceholder
          (DescriptorBuilder *this,string *name,string *relative_to,ResolveMode resolve_mode)

{
  size_type sVar1;
  Type TVar2;
  long lVar3;
  ulong uVar4;
  Symbol SVar6;
  string first_part_of_name;
  string scope_to_try;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar5;
  
  this->possible_undeclared_dependency_ = (FileDescriptor *)0x0;
  if ((name->_M_string_length == 0) || (*(name->_M_dataplus)._M_p != '.')) {
    lVar3 = std::__cxx11::string::find((char)name,0x2e);
    first_part_of_name._M_dataplus._M_p = (pointer)&first_part_of_name.field_2;
    first_part_of_name._M_string_length = 0;
    first_part_of_name.field_2._M_local_buf[0] = '\0';
    if (lVar3 == -1) {
      std::__cxx11::string::_M_assign((string *)&first_part_of_name);
    }
    else {
      std::__cxx11::string::substr((ulong)&scope_to_try,(ulong)name);
      std::__cxx11::string::operator=((string *)&first_part_of_name,(string *)&scope_to_try);
      std::__cxx11::string::~string((string *)&scope_to_try);
    }
    std::__cxx11::string::string((string *)&scope_to_try,(string *)relative_to);
    while( true ) {
      uVar4 = std::__cxx11::string::rfind((char)&scope_to_try,0x2e);
      if (uVar4 == 0xffffffffffffffff) break;
      std::__cxx11::string::erase((ulong)&scope_to_try,uVar4);
      sVar1 = scope_to_try._M_string_length;
      std::__cxx11::string::append((ulong)&scope_to_try,'\x01');
      std::__cxx11::string::append((string *)&scope_to_try);
      SVar6 = FindSymbol(this,&scope_to_try);
      aVar5 = SVar6.field_1;
      TVar2 = SVar6.type;
      if (TVar2 != NULL_SYMBOL) {
        if (first_part_of_name._M_string_length < name->_M_string_length) {
          if ((TVar2 - MESSAGE & 0xfffffff9) == 0) {
            std::__cxx11::string::append
                      ((string *)&scope_to_try,(ulong)name,first_part_of_name._M_string_length);
            SVar6 = FindSymbol(this,&scope_to_try);
            goto LAB_001e601a;
          }
        }
        else if ((resolve_mode != LOOKUP_TYPES) || ((TVar2 & ~FIELD) == MESSAGE)) goto LAB_001e601f;
      }
      std::__cxx11::string::erase((ulong)&scope_to_try,sVar1);
    }
    SVar6 = FindSymbol(this,name);
LAB_001e601a:
    aVar5 = SVar6.field_1;
    TVar2 = SVar6.type;
LAB_001e601f:
    std::__cxx11::string::~string((string *)&scope_to_try);
  }
  else {
    std::__cxx11::string::substr((ulong)&first_part_of_name,(ulong)name);
    SVar6 = FindSymbol(this,&first_part_of_name);
    aVar5 = SVar6.field_1;
    TVar2 = SVar6.type;
  }
  std::__cxx11::string::~string((string *)&first_part_of_name);
  SVar6._4_4_ = 0;
  SVar6.type = TVar2;
  SVar6.field_1.descriptor = aVar5.descriptor;
  return SVar6;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbolNoPlaceholder(
    const string& name, const string& relative_to, ResolveMode resolve_mode) {
  possible_undeclared_dependency_ = NULL;

  if (name.size() > 0 && name[0] == '.') {
    // Fully-qualified name.
    return FindSymbol(name.substr(1));
  }

  // If name is something like "Foo.Bar.baz", and symbols named "Foo" are
  // defined in multiple parent scopes, we only want to find "Bar.baz" in the
  // innermost one.  E.g., the following should produce an error:
  //   message Bar { message Baz {} }
  //   message Foo {
  //     message Bar {
  //     }
  //     optional Bar.Baz baz = 1;
  //   }
  // So, we look for just "Foo" first, then look for "Bar.baz" within it if
  // found.
  string::size_type name_dot_pos = name.find_first_of('.');
  string first_part_of_name;
  if (name_dot_pos == string::npos) {
    first_part_of_name = name;
  } else {
    first_part_of_name = name.substr(0, name_dot_pos);
  }

  string scope_to_try(relative_to);

  while (true) {
    // Chop off the last component of the scope.
    string::size_type dot_pos = scope_to_try.find_last_of('.');
    if (dot_pos == string::npos) {
      return FindSymbol(name);
    } else {
      scope_to_try.erase(dot_pos);
    }

    // Append ".first_part_of_name" and try to find.
    string::size_type old_size = scope_to_try.size();
    scope_to_try.append(1, '.');
    scope_to_try.append(first_part_of_name);
    Symbol result = FindSymbol(scope_to_try);
    if (!result.IsNull()) {
      if (first_part_of_name.size() < name.size()) {
        // name is a compound symbol, of which we only found the first part.
        // Now try to look up the rest of it.
        if (result.IsAggregate()) {
          scope_to_try.append(name, first_part_of_name.size(),
                              name.size() - first_part_of_name.size());
          return FindSymbol(scope_to_try);
        } else {
          // We found a symbol but it's not an aggregate.  Continue the loop.
        }
      } else {
        if (resolve_mode == LOOKUP_TYPES && !result.IsType()) {
          // We found a symbol but it's not a type.  Continue the loop.
        } else {
          return result;
        }
      }
    }

    // Not found.  Remove the name so we can try again.
    scope_to_try.erase(old_size);
  }
}